

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaHeat2D_kry.c
# Opt level: O3

int resHeat(sunrealtype tt,N_Vector uu,N_Vector up,N_Vector rr,void *user_data)

{
  long lVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  
  lVar4 = N_VGetArrayPointer();
  lVar5 = N_VGetArrayPointer(up);
  lVar6 = N_VGetArrayPointer(rr);
  lVar3 = *user_data;
  dVar2 = *(double *)((long)user_data + 0x10);
  N_VScale(0x3ff0000000000000,uu,rr);
  lVar7 = lVar3 * 0x10 + lVar4;
  lVar1 = lVar3 * 8;
  lVar8 = lVar4 + lVar3 * 8;
  lVar5 = lVar5 + lVar3 * 8;
  lVar6 = lVar3 * 8 + lVar6;
  lVar9 = 1;
  do {
    if (2 < lVar3) {
      lVar10 = 2;
      do {
        dVar11 = *(double *)(lVar8 + -8 + lVar10 * 8);
        dVar11 = dVar11 + dVar11;
        *(double *)(lVar6 + -8 + lVar10 * 8) =
             (((*(double *)(lVar7 + -8 + lVar10 * 8) + *(double *)(lVar4 + -8 + lVar10 * 8)) -
              dVar11) +
             ((*(double *)(lVar8 + lVar10 * 8) + *(double *)(lVar8 + -0x10 + lVar10 * 8)) - dVar11))
             * -dVar2 + *(double *)(lVar5 + -8 + lVar10 * 8);
        lVar10 = lVar10 + 1;
      } while (lVar3 != lVar10);
    }
    lVar9 = lVar9 + 1;
    lVar7 = lVar7 + lVar1;
    lVar8 = lVar8 + lVar1;
    lVar4 = lVar4 + lVar1;
    lVar5 = lVar5 + lVar1;
    lVar6 = lVar6 + lVar1;
  } while (lVar9 != 9);
  return 0;
}

Assistant:

int resHeat(sunrealtype tt, N_Vector uu, N_Vector up, N_Vector rr, void* user_data)
{
  sunindextype i, j, offset, loc, mm;
  sunrealtype *uu_data, *up_data, *rr_data, coeff, dif1, dif2;
  UserData data;

  uu_data = N_VGetArrayPointer(uu);
  up_data = N_VGetArrayPointer(up);
  rr_data = N_VGetArrayPointer(rr);

  data = (UserData)user_data;

  coeff = data->coeff;
  mm    = data->mm;

  /* Initialize rr to uu, to take care of boundary equations. */
  N_VScale(ONE, uu, rr);

  /* Loop over interior points; set res = up - (central difference). */
  for (j = 1; j < MGRID - 1; j++)
  {
    offset = mm * j;
    for (i = 1; i < mm - 1; i++)
    {
      loc          = offset + i;
      dif1         = uu_data[loc - 1] + uu_data[loc + 1] - TWO * uu_data[loc];
      dif2         = uu_data[loc - mm] + uu_data[loc + mm] - TWO * uu_data[loc];
      rr_data[loc] = up_data[loc] - coeff * (dif1 + dif2);
    }
  }

  return (0);
}